

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_>_>_>
           *this,BufferID *p,ulong hash,arrays_type *arrays_,long *num_destroyed)

{
  pointer p_00;
  pair<slang::BufferID_&&,_std::vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>_&&>
  local_40;
  locator local_30;
  
  *num_destroyed = *num_destroyed + 1;
  local_40.first = p;
  local_40.second =
       (vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
        *)(p + 2);
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
  ::
  nosize_unchecked_emplace_at<std::pair<slang::BufferID&&,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>&&>>
            (&local_30,
             (table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::BufferID,void>,std::equal_to<slang::BufferID>,std::allocator<std::pair<slang::BufferID_const,std::vector<slang::DiagnosticEngine::DiagnosticMapping,std::allocator<slang::DiagnosticEngine::DiagnosticMapping>>>>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_40);
  p_00 = (((vector<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
            *)(p + 2))->
         super__Vector_base<slang::DiagnosticEngine::DiagnosticMapping,_std::allocator<slang::DiagnosticEngine::DiagnosticMapping>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if (p_00 != (pointer)0x0) {
    operator_delete(p_00,*(long *)(p + 6) - (long)p_00);
  }
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }